

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lr_guarded.hpp
# Opt level: O0

shared_handle __thiscall
gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::lock_shared
          (lr_guarded<int,_std::timed_mutex> *this)

{
  bool bVar1;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  _Head_base<0UL,_const_int_*,_false> _Var2;
  pointer in_RSI;
  shared_handle sVar3;
  shared_deleter local_38;
  shared_deleter local_30;
  shared_deleter local_28;
  shared_deleter local_20 [2];
  lr_guarded<int,_std::timed_mutex> *this_local;
  
  this_local = this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)((long)in_RSI + 9));
  if (bVar1) {
    std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RSI + 3),0);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(in_RSI + 2));
    if (bVar1) {
      shared_deleter::shared_deleter(local_20,(atomic<int> *)(in_RSI + 3));
      std::unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
      ::unique_ptr<gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter,void>
                ((unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
                  *)this,in_RSI,local_20);
      _Var2._M_head_impl = extraout_RDX;
    }
    else {
      shared_deleter::shared_deleter(&local_28,(atomic<int> *)(in_RSI + 3));
      std::unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
      ::unique_ptr<gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter,void>
                ((unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
                  *)this,in_RSI + 1,&local_28);
      _Var2._M_head_impl = extraout_RDX_00;
    }
  }
  else {
    std::__atomic_base<int>::operator++((__atomic_base<int> *)(in_RSI + 4),0);
    bVar1 = std::atomic::operator_cast_to_bool((atomic *)(in_RSI + 2));
    if (bVar1) {
      shared_deleter::shared_deleter(&local_30,(atomic<int> *)(in_RSI + 4));
      std::unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
      ::unique_ptr<gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter,void>
                ((unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
                  *)this,in_RSI,&local_30);
      _Var2._M_head_impl = extraout_RDX_01;
    }
    else {
      shared_deleter::shared_deleter(&local_38,(atomic<int> *)(in_RSI + 4));
      std::unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
      ::unique_ptr<gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter,void>
                ((unique_ptr<int_const,gmlc::libguarded::lr_guarded<int,std::timed_mutex>::shared_deleter>
                  *)this,in_RSI + 1,&local_38);
      _Var2._M_head_impl = extraout_RDX_02;
    }
  }
  sVar3._M_t.
  super___uniq_ptr_impl<const_int,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_const_int_*,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
  .super__Head_base<0UL,_const_int_*,_false>._M_head_impl = _Var2._M_head_impl;
  sVar3._M_t.
  super___uniq_ptr_impl<const_int,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_const_int_*,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
  .super__Tuple_impl<1UL,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>.
  super__Head_base<1UL,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter,_false>.
  _M_head_impl.m_readingCount =
       (_Head_base<1UL,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter,_false>)
       (_Head_base<1UL,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter,_false>)
       this;
  return (shared_handle)
         sVar3._M_t.
         super___uniq_ptr_impl<const_int,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
         ._M_t.
         super__Tuple_impl<0UL,_const_int_*,_gmlc::libguarded::lr_guarded<int,_std::timed_mutex>::shared_deleter>
  ;
}

Assistant:

auto lr_guarded<T, M>::lock_shared() const -> shared_handle
{
    if (m_countingLeft) {
        m_leftReadCount++;
        if (m_readingLeft) {
            return shared_handle(&m_left, shared_deleter(m_leftReadCount));
        } else {
            return shared_handle(&m_right, shared_deleter(m_leftReadCount));
        }
    } else {
        m_rightReadCount++;
        if (m_readingLeft) {
            return shared_handle(&m_left, shared_deleter(m_rightReadCount));
        } else {
            return shared_handle(&m_right, shared_deleter(m_rightReadCount));
        }
    }
}